

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprModule * AnalyzeModule(ExpressionContext *ctx,SynModule *syntax)

{
  CompilerStatistics *this;
  uint uVar1;
  Allocator *pAVar2;
  TypeBase *pTVar3;
  ScopeData *pSVar4;
  ExprBase **ppEVar5;
  ExprBase **ppEVar6;
  FunctionData *pFVar7;
  TypeClass *pTVar8;
  VariableData *pVVar9;
  InplaceStr name;
  undefined1 auVar10 [8];
  uint uVar11;
  int iVar12;
  ByteCode *bytecode;
  Lexeme *lexStream;
  ExprBase *pEVar13;
  undefined4 extraout_var;
  char *pcVar15;
  SynBase *pSVar16;
  undefined4 extraout_var_00;
  _func_int **pp_Var17;
  ulong uVar18;
  ulong uVar19;
  SynModuleImport *syntax_00;
  IntrusiveList<ExprBase> *this_00;
  IntrusiveList<ExprBase> expressions;
  TraceScope traceScope_3;
  TraceScope traceScope;
  uint lexStreamSize;
  SmallArray<TypeClass_*,_32U> classTypes;
  IntrusiveList<ExprBase> local_2a8;
  TraceScope local_298;
  char *local_288;
  char *pcStack_280;
  TraceScope local_278;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  ExprBase local_258 [5];
  Allocator *local_158;
  SmallArray<TypeClass_*,_32U> local_148;
  ExprModule *pEVar14;
  undefined4 extraout_var_01;
  
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar12 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar12 != 0) {
      AnalyzeModule::token = NULLC::TraceGetToken("analyze","AnalyzeModule");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_278,AnalyzeModule::token);
  uVar11 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar11;
  (ctx->statistics).finishTime = 0;
  bytecode = (ByteCode *)BinaryCache::GetBytecode("$base$.nc");
  if (bytecode != (ByteCode *)0x0) {
    local_268 = (undefined1  [8])((ulong)local_268 & 0xffffffff00000000);
    lexStream = BinaryCache::GetLexems("$base$.nc",(uint *)local_268);
    local_288 = "$base$.nc";
    pcStack_280 = "";
    name.end = "";
    name.begin = "$base$.nc";
    ImportModule(ctx,&syntax->super_SynBase,bytecode,lexStream,local_268._0_4_,name);
    ctx->baseModuleFunctionCount = (ctx->functions).count;
  }
  syntax_00 = (syntax->imports).head;
  if (syntax_00 != (SynModuleImport *)0x0) {
    do {
      AnalyzeModuleImport(ctx,syntax_00);
      syntax_00 = (SynModuleImport *)(syntax_00->super_SynBase).next;
      if (syntax_00 == (SynModuleImport *)0x0) break;
    } while ((syntax_00->super_SynBase).typeID == 0x42);
  }
  AnalyzeImplicitModuleImports(ctx);
  uVar11 = NULLCTime::clockMicro();
  this = &ctx->statistics;
  CompilerStatistics::Finish(this,"Import",uVar11);
  uVar11 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar11;
  (ctx->statistics).finishTime = 0;
  local_2a8.head = (ExprBase *)0x0;
  local_2a8.tail = (ExprBase *)0x0;
  pSVar16 = (syntax->expressions).head;
  if (pSVar16 != (SynBase *)0x0) {
    do {
      pEVar13 = AnalyzeStatement(ctx,pSVar16);
      IntrusiveList<ExprBase>::push_back(&local_2a8,pEVar13);
      pSVar16 = pSVar16->next;
    } while (pSVar16 != (SynBase *)0x0);
  }
  uVar11 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this,"Expressions",uVar11);
  uVar11 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar11;
  (ctx->statistics).finishTime = 0;
  ClosePendingUpvalues(ctx,(FunctionData *)0x0);
  if (ctx->errorCount == 0) {
    CreateDefaultArgumentFunctionWrappers(ctx);
  }
  iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  pEVar14 = (ExprModule *)CONCAT44(extraout_var,iVar12);
  pAVar2 = ctx->allocator;
  pTVar3 = ctx->typeVoid;
  pSVar4 = ctx->globalScope;
  local_268 = (undefined1  [8])local_2a8.head;
  auVar10 = local_268;
  uStack_260 = local_2a8.tail;
  pEVar13 = uStack_260;
  (pEVar14->super_ExprBase).typeID = 0x38;
  (pEVar14->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar14->super_ExprBase).type = pTVar3;
  (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar14->super_ExprBase).listed = false;
  (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprModule_003e7200;
  pEVar14->moduleScope = pSVar4;
  (pEVar14->definitions).allocator = pAVar2;
  (pEVar14->definitions).data = (pEVar14->definitions).little;
  (pEVar14->definitions).count = 0;
  (pEVar14->definitions).max = 0x20;
  (pEVar14->setup).head = (ExprBase *)0x0;
  (pEVar14->setup).tail = (ExprBase *)0x0;
  local_268._0_4_ = SUB84(local_2a8.head,0);
  local_268._4_4_ = (undefined4)((ulong)local_2a8.head >> 0x20);
  uStack_260._0_4_ = (uint)local_2a8.tail;
  uStack_260._4_4_ = (uint)((ulong)local_2a8.tail >> 0x20);
  *(undefined4 *)&(pEVar14->expressions).head = local_268._0_4_;
  *(undefined4 *)((long)&(pEVar14->expressions).head + 4) = local_268._4_4_;
  *(uint *)&(pEVar14->expressions).tail = (uint)uStack_260;
  *(uint *)((long)&(pEVar14->expressions).tail + 4) = uStack_260._4_4_;
  local_268 = auVar10;
  uStack_260 = pEVar13;
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar12 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar12 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","definitions");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_268,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  if ((ctx->definitions).count != 0) {
    uVar11 = (pEVar14->definitions).count;
    uVar18 = 0;
    do {
      ppEVar5 = (ctx->definitions).data;
      if (uVar11 == (pEVar14->definitions).max) {
        SmallArray<ExprBase_*,_32U>::grow(&pEVar14->definitions,uVar11);
      }
      ppEVar6 = (pEVar14->definitions).data;
      if (ppEVar6 == (ExprBase **)0x0) {
        pcVar15 = "void SmallArray<ExprBase *, 32>::push_back(const T &) [T = ExprBase *, N = 32]";
        goto LAB_00204049;
      }
      pEVar13 = ppEVar5[uVar18];
      uVar1 = (pEVar14->definitions).count;
      uVar11 = uVar1 + 1;
      (pEVar14->definitions).count = uVar11;
      ppEVar6[uVar1] = pEVar13;
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ctx->definitions).count);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_268);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar12 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar12 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token = NULLC::TraceGetToken("analyze","setup");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_268,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  this_00 = &pEVar14->setup;
  if ((ctx->setup).count != 0) {
    uVar18 = 0;
    do {
      IntrusiveList<ExprBase>::push_back(this_00,(ctx->setup).data[uVar18]);
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ctx->setup).count);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_268);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar12 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar12 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","vtables");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_298,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  local_158 = ctx->allocator;
  local_268 = (undefined1  [8])local_258;
  uStack_260 = (ExprBase *)0x2000000000;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  uVar11 = (ctx->functions).count;
  uVar18 = (ulong)uVar11;
  local_148.allocator = local_158;
  if (uVar11 != 0) {
    uVar11 = 0;
    uVar19 = 0;
    do {
      pFVar7 = (ctx->functions).data[uVar19];
      pTVar3 = pFVar7->scope->ownerType;
      if ((pTVar3 != (TypeBase *)0x0) && (pTVar3->isGeneric == false)) {
        pcVar15 = strstr((pFVar7->name->name).begin,"::");
        if (pcVar15 != (char *)0x0) {
          if (uVar11 == uStack_260._4_4_) {
            SmallArray<FunctionData_*,_32U>::grow
                      ((SmallArray<FunctionData_*,_32U> *)local_268,uVar11);
          }
          if (local_268 == (undefined1  [8])0x0) {
            pcVar15 = 
            "void SmallArray<FunctionData *, 32>::push_back(const T &) [T = FunctionData *, N = 32]"
            ;
            goto LAB_00204049;
          }
          uVar18 = (ulong)uStack_260 & 0xffffffff;
          uVar11 = (uint)uStack_260 + 1;
          uStack_260 = (ExprBase *)CONCAT44(uStack_260._4_4_,uVar11);
          ((_func_int ***)local_268)[uVar18] = (_func_int **)pFVar7;
          uVar18 = (ulong)(ctx->functions).count;
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar18);
  }
  uVar11 = (ctx->types).count;
  if (uVar11 != 0) {
    uVar18 = 0;
    do {
      pTVar8 = (TypeClass *)(ctx->types).data[uVar18];
      if ((pTVar8 != (TypeClass *)0x0) && ((pTVar8->super_TypeStruct).super_TypeBase.typeID == 0x18)
         ) {
        if (local_148.count == local_148.max) {
          SmallArray<TypeClass_*,_32U>::grow(&local_148,local_148.count);
        }
        if (local_148.data == (TypeClass **)0x0) {
          pcVar15 = 
          "void SmallArray<TypeClass *, 32>::push_back(const T &) [T = TypeClass *, N = 32]";
LAB_00204049:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,pcVar15);
        }
        uVar19 = local_148._8_8_ & 0xffffffff;
        local_148.count = local_148.count + 1;
        local_148.data[uVar19] = pTVar8;
        uVar11 = (ctx->types).count;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar11);
  }
  if ((ctx->vtables).count != 0) {
    uVar18 = 0;
    do {
      pSVar16 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      if ((ctx->vtables).count <= uVar18) goto LAB_00203fe7;
      pEVar13 = CreateVirtualTableUpdate
                          (ctx,pSVar16,(ctx->vtables).data[uVar18],
                           (SmallArray<FunctionData_*,_32U> *)local_268,&local_148);
      IntrusiveList<ExprBase>::push_back(this_00,pEVar13);
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ctx->vtables).count);
  }
  SmallArray<TypeClass_*,_32U>::~SmallArray(&local_148);
  SmallArray<FunctionData_*,_32U>::~SmallArray((SmallArray<FunctionData_*,_32U> *)local_268);
  NULLC::TraceScope::~TraceScope(&local_298);
  if (AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') {
    iVar12 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    if (iVar12 != 0) {
      AnalyzeModule(ExpressionContext&,SynModule*)::token =
           NULLC::TraceGetToken("analyze","upvalues");
      __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
    }
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_268,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  if ((ctx->upvalues).count != 0) {
    uVar18 = 0;
    do {
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_00,iVar12);
      pSVar16 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      pTVar3 = ctx->typeVoid;
      iVar12 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var17 = (_func_int **)CONCAT44(extraout_var_01,iVar12);
      if ((ctx->upvalues).count <= uVar18) {
LAB_00203fe7:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VariableData *, 128>::operator[](unsigned int) [T = VariableData *, N = 128]"
                     );
      }
      pVVar9 = (ctx->upvalues).data[uVar18];
      *pp_Var17 = (_func_int *)0x0;
      pp_Var17[1] = (_func_int *)pVVar9;
      pp_Var17[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var17 + 3) = 0;
      pEVar13->typeID = 0x1e;
      pEVar13->source = pSVar16;
      pEVar13->type = pTVar3;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e64e0;
      pEVar13[1]._vptr_ExprBase = pp_Var17;
      *(undefined8 *)&pEVar13[1].typeID = 0;
      IntrusiveList<ExprBase>::push_back(this_00,pEVar13);
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ctx->upvalues).count);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_268);
  uVar11 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this,"Finalization",uVar11);
  NULLC::TraceScope::~TraceScope(&local_278);
  return pEVar14;
}

Assistant:

ExprModule* AnalyzeModule(ExpressionContext &ctx, SynModule *syntax)
{
	TRACE_SCOPE("analyze", "AnalyzeModule");

	ctx.statistics.Start(NULLCTime::clockMicro());

	// Import base module
	if(const char *bytecode = BinaryCache::GetBytecode("$base$.nc"))
	{
		unsigned lexStreamSize = 0;
		Lexeme *lexStream = BinaryCache::GetLexems("$base$.nc", lexStreamSize);

		if(bytecode)
			ImportModule(ctx, syntax, (ByteCode*)bytecode, lexStream, lexStreamSize, InplaceStr("$base$.nc"));
		else
			Stop(ctx, syntax, "ERROR: base module couldn't be imported");

		ctx.baseModuleFunctionCount = ctx.functions.size();
	}

	for(SynModuleImport *import = syntax->imports.head; import; import = getType<SynModuleImport>(import->next))
		AnalyzeModuleImport(ctx, import);

	AnalyzeImplicitModuleImports(ctx);

	ctx.statistics.Finish("Import", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expr = syntax->expressions.head; expr; expr = expr->next)
		expressions.push_back(AnalyzeStatement(ctx, expr));

	ctx.statistics.Finish("Expressions", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	ClosePendingUpvalues(ctx, NULL);

	// Don't create wrappers in ill-formed module
	if(ctx.errorCount == 0)
		CreateDefaultArgumentFunctionWrappers(ctx);

	ExprModule *module = new (ctx.get<ExprModule>()) ExprModule(ctx.allocator, syntax, ctx.typeVoid, ctx.globalScope, expressions);

	{
		TRACE_SCOPE("analyze", "definitions");

		for(unsigned i = 0; i < ctx.definitions.size(); i++)
			module->definitions.push_back(ctx.definitions[i]);
	}

	{
		TRACE_SCOPE("analyze", "setup");

		for(unsigned i = 0; i < ctx.setup.size(); i++)
			module->setup.push_back(ctx.setup[i]);
	}

	{
		TRACE_SCOPE("analyze", "vtables");

		SmallArray<FunctionData*, 32> possibleFunctions(ctx.allocator);
		SmallArray<TypeClass*, 32> classTypes(ctx.allocator);

		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			TypeBase *parentType = function->scope->ownerType;

			if(!parentType)
				continue;

			if(parentType->isGeneric)
				continue;

			const char *pos = strstr(function->name->name.begin, "::");

			if(!pos)
				continue;

			possibleFunctions.push_back(function);
		}

		for(unsigned i = 0; i < ctx.types.size(); i++)
		{
			TypeBase *type = ctx.types[i];

			if(TypeClass *classType = getType<TypeClass>(type))
				classTypes.push_back(classType);
		}

		for(unsigned i = 0; i < ctx.vtables.size(); i++)
			module->setup.push_back(CreateVirtualTableUpdate(ctx, ctx.MakeInternal(syntax), ctx.vtables[i], possibleFunctions, classTypes));
	}

	{
		TRACE_SCOPE("analyze", "upvalues");

		for(unsigned i = 0; i < ctx.upvalues.size(); i++)
			module->setup.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(ctx.MakeInternal(syntax), ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, ctx.upvalues[i]), NULL));
	}

	ctx.statistics.Finish("Finalization", NULLCTime::clockMicro());

	return module;
}